

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLogLog>::
operator()(LineStripRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLogLog>
           *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  unsigned_long_long uVar1;
  unsigned_long_long uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  ImU32 IVar8;
  uint uVar9;
  GetterXsYs<unsigned_long_long> *pGVar10;
  TransformerLogLog *pTVar11;
  ImPlotPlot *pIVar12;
  ImDrawVert *pIVar13;
  ImDrawVert *pIVar14;
  ImDrawIdx *pIVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [12];
  ImPlotContext *pIVar20;
  int iVar21;
  long lVar22;
  ImDrawIdx IVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  
  pIVar20 = GImPlot;
  pGVar10 = this->Getter;
  pTVar11 = this->Transformer;
  iVar21 = pGVar10->Count;
  lVar22 = (long)(((pGVar10->Offset + prim + 1) % iVar21 + iVar21) % iVar21) * (long)pGVar10->Stride
  ;
  uVar1 = *(unsigned_long_long *)((long)pGVar10->Xs + lVar22);
  uVar2 = *(unsigned_long_long *)((long)pGVar10->Ys + lVar22);
  dVar16 = log10((((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar12 = pIVar20->CurrentPlot;
  dVar3 = pIVar20->LogDenX;
  dVar4 = (pIVar12->XAxis).Range.Min;
  dVar5 = (pIVar12->XAxis).Range.Max;
  dVar17 = log10((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                 pIVar12->YAxis[pTVar11->YAxis].Range.Min);
  iVar21 = pTVar11->YAxis;
  pIVar12 = pIVar20->CurrentPlot;
  auVar28._8_8_ = dVar17;
  auVar28._0_8_ = dVar16;
  auVar29._8_4_ = SUB84(pIVar20->LogDenY[iVar21],0);
  auVar29._0_8_ = dVar3;
  auVar29._12_4_ = (int)((ulong)pIVar20->LogDenY[iVar21] >> 0x20);
  auVar29 = divpd(auVar28,auVar29);
  dVar3 = pIVar12->YAxis[iVar21].Range.Min;
  IVar6 = pIVar20->PixelRange[iVar21].Min;
  fVar24 = (float)(pIVar20->Mx *
                   (((double)(float)auVar29._0_8_ * (dVar5 - dVar4) + dVar4) -
                   (pIVar12->XAxis).Range.Min) + (double)IVar6.x);
  fVar25 = (float)(pIVar20->My[iVar21] *
                   (((double)(float)auVar29._8_8_ * (pIVar12->YAxis[iVar21].Range.Max - dVar3) +
                    dVar3) - dVar3) + (double)IVar6.y);
  fVar26 = (this->P1).x;
  fVar27 = (this->P1).y;
  auVar33._0_4_ = ~-(uint)(fVar24 <= fVar26) & (uint)fVar24;
  auVar33._4_4_ = ~-(uint)(fVar25 <= fVar27) & (uint)fVar25;
  auVar33._8_4_ = ~-(uint)(fVar26 < fVar24) & (uint)fVar24;
  auVar33._12_4_ = ~-(uint)(fVar27 < fVar25) & (uint)fVar25;
  auVar18._4_4_ = (uint)fVar27 & -(uint)(fVar25 <= fVar27);
  auVar18._0_4_ = (uint)fVar26 & -(uint)(fVar24 <= fVar26);
  auVar18._8_4_ = (uint)fVar26 & -(uint)(fVar26 < fVar24);
  auVar18._12_4_ = (uint)fVar27 & -(uint)(fVar27 < fVar25);
  auVar33 = auVar33 | auVar18;
  fVar30 = (cull_rect->Min).y;
  auVar19._4_8_ = auVar33._8_8_;
  auVar19._0_4_ = -(uint)(auVar33._4_4_ < fVar30);
  auVar34._0_8_ = auVar19._0_8_ << 0x20;
  auVar34._8_4_ = -(uint)(auVar33._8_4_ < (cull_rect->Max).x);
  auVar34._12_4_ = -(uint)(auVar33._12_4_ < (cull_rect->Max).y);
  auVar35._4_4_ = -(uint)(fVar30 < auVar33._4_4_);
  auVar35._0_4_ = -(uint)((cull_rect->Min).x < auVar33._0_4_);
  auVar35._8_8_ = auVar34._8_8_;
  iVar21 = movmskps((int)pIVar12,auVar35);
  if (iVar21 == 0xf) {
    IVar8 = this->Col;
    IVar6 = *uv;
    fVar30 = fVar24 - fVar26;
    fVar31 = fVar25 - fVar27;
    fVar32 = fVar30 * fVar30 + fVar31 * fVar31;
    if (0.0 < fVar32) {
      fVar32 = 1.0 / SQRT(fVar32);
      fVar30 = fVar30 * fVar32;
      fVar31 = fVar31 * fVar32;
    }
    fVar32 = this->Weight * 0.5;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13->uv = IVar6;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14->col = IVar8;
    fVar30 = fVar32 * fVar30;
    fVar32 = fVar32 * fVar31;
    (pIVar13->pos).x = fVar26 + fVar32;
    (pIVar13->pos).y = fVar27 - fVar30;
    pIVar14[1].pos.x = fVar32 + fVar24;
    pIVar14[1].pos.y = fVar25 - fVar30;
    pIVar14[1].uv = IVar6;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[1].col = IVar8;
    pIVar13[2].pos.x = fVar24 - fVar32;
    pIVar13[2].pos.y = fVar30 + fVar25;
    pIVar13[2].uv = IVar6;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[2].col = IVar8;
    IVar7 = this->P1;
    pIVar13[3].pos.x = IVar7.x - fVar32;
    pIVar13[3].pos.y = IVar7.y + fVar30;
    pIVar13[3].uv.x = IVar6.x;
    pIVar13[3].uv.y = IVar6.y;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[3].col = IVar8;
    DrawList->_VtxWritePtr = pIVar13 + 4;
    uVar9 = DrawList->_VtxCurrentIdx;
    pIVar15 = DrawList->_IdxWritePtr;
    IVar23 = (ImDrawIdx)uVar9;
    *pIVar15 = IVar23;
    pIVar15[1] = IVar23 + 1;
    pIVar15[2] = IVar23 + 2;
    pIVar15[3] = IVar23;
    pIVar15[4] = IVar23 + 2;
    pIVar15[5] = IVar23 + 3;
    DrawList->_IdxWritePtr = pIVar15 + 6;
    DrawList->_VtxCurrentIdx = uVar9 + 4;
  }
  IVar6.y = fVar25;
  IVar6.x = fVar24;
  this->P1 = IVar6;
  return (char)iVar21 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }